

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnaryBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::UnaryBinsSelectExpr,slang::ast::BinsSelectExpr_const&>
          (BumpAllocator *this,BinsSelectExpr *args)

{
  UnaryBinsSelectExpr *expr;
  UnaryBinsSelectExpr *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  expr = (UnaryBinsSelectExpr *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  ast::UnaryBinsSelectExpr::UnaryBinsSelectExpr(in_RSI,(BinsSelectExpr *)expr);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }